

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_globaltype_t * wasm_global_type(wasm_global_t *global)

{
  wasm_globaltype_t *this;
  Global *this_00;
  GlobalType *pGVar1;
  GlobalType local_28;
  wasm_ref_t *local_10;
  wasm_global_t *global_local;
  
  local_10 = (wasm_ref_t *)global;
  this = (wasm_globaltype_t *)operator_new(0x18);
  this_00 = wasm_ref_t::As<wabt::interp::Global>(local_10);
  pGVar1 = wabt::interp::Global::type(this_00);
  wabt::interp::GlobalType::GlobalType(&local_28,pGVar1);
  wasm_globaltype_t::wasm_globaltype_t(this,&local_28);
  wabt::interp::GlobalType::~GlobalType(&local_28);
  return this;
}

Assistant:

own wasm_globaltype_t* wasm_global_type(const wasm_global_t* global) {
  return new wasm_globaltype_t{global->As<Global>()->type()};
}